

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::BaseRAPass::useTemporaryMem
          (BaseRAPass *this,BaseMem *out,uint32_t size,uint32_t alignment)

{
  uint uVar1;
  uint32_t uVar2;
  Error EVar3;
  VirtReg *pVVar4;
  
  if (0x40 < alignment) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
               ,0x6c2,"alignment <= 64");
  }
  uVar1 = (this->_temporaryMem).super_Operand_._signature._bits;
  if (uVar1 == 0) {
    EVar3 = BaseCompiler::_newStack
                      ((BaseCompiler *)(this->super_FuncPass).super_Pass._cb,
                       (BaseMem *)&this->_temporaryMem,size,alignment,(char *)0x0);
    if (EVar3 != 0) {
      return EVar3;
    }
  }
  else {
    if ((uVar1 >> 0xd & 1) == 0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/rapass.cpp"
                 ,0x6c8,"_temporaryMem.as<BaseMem>().isRegHome()");
    }
    uVar2 = (this->_temporaryMem).super_Operand_._baseId;
    pVVar4 = BaseCompiler::virtRegById((BaseCompiler *)(this->super_FuncPass).super_Pass._cb,uVar2);
    if (size < *(uint *)(pVVar4 + 8)) {
      size = *(uint *)(pVVar4 + 8);
    }
    if (alignment < (byte)pVVar4[0xc]) {
      alignment = (uint)(byte)pVVar4[0xc];
    }
    BaseCompiler::setStackSize
              ((BaseCompiler *)(this->super_FuncPass).super_Pass._cb,uVar2,size,alignment);
  }
  uVar2 = (this->_temporaryMem).super_Operand_._baseId;
  (out->super_Operand).super_Operand_._signature =
       (Signature)(this->_temporaryMem).super_Operand_._signature._bits;
  (out->super_Operand).super_Operand_._baseId = uVar2;
  (out->super_Operand).super_Operand_._data[0] = (this->_temporaryMem).super_Operand_._data[0];
  (out->super_Operand).super_Operand_._data[1] = (this->_temporaryMem).super_Operand_._data[1];
  return 0;
}

Assistant:

Error BaseRAPass::useTemporaryMem(BaseMem& out, uint32_t size, uint32_t alignment) noexcept {
  ASMJIT_ASSERT(alignment <= 64);

  if (_temporaryMem.isNone()) {
    ASMJIT_PROPAGATE(cc()->_newStack(&_temporaryMem.as<BaseMem>(), size, alignment));
  }
  else {
    ASMJIT_ASSERT(_temporaryMem.as<BaseMem>().isRegHome());

    uint32_t virtId = _temporaryMem.as<BaseMem>().baseId();
    VirtReg* virtReg = cc()->virtRegById(virtId);

    cc()->setStackSize(virtId, Support::max(virtReg->virtSize(), size),
                               Support::max(virtReg->alignment(), alignment));
  }

  out = _temporaryMem.as<BaseMem>();
  return kErrorOk;
}